

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O0

Vector __thiscall
anurbs::Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_>::point_at
          (Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this,double u,double v)

{
  element_type *peVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  Vector VVar3;
  shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_> local_38;
  double local_28;
  double v_local;
  double u_local;
  Surface<2L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<2L>_>_> *this_local;
  
  local_28 = v;
  v_local = u;
  this_local = this;
  Ref<anurbs::NurbsSurfaceGeometry<2L>_>::operator->
            ((Ref<anurbs::NurbsSurfaceGeometry<2L>_> *)&local_38);
  peVar1 = std::
           __shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<anurbs::NurbsSurfaceGeometry<2L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_38);
  dVar2 = local_28;
  (*(peVar1->super_SurfaceBase<2L>)._vptr_SurfaceBase[6])(v_local,this);
  std::shared_ptr<anurbs::NurbsSurfaceGeometry<2L>_>::~shared_ptr(&local_38);
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[1] =
       dVar2;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.array[0] =
       extraout_XMM0_Qa;
  return (Vector)VVar3.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data
                 .array;
}

Assistant:

Vector point_at(const double u, const double v) const override
    {
        return m_surface_geometry->point_at(u, v);
    }